

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O3

void __thiscall ExecutorX86::SaveListing(ExecutorX86 *this,OutputContext *output)

{
  byte bVar1;
  uint uVar2;
  x86Instruction *pxVar3;
  Linker *pLVar4;
  RegVmCmd *pRVar5;
  size_t sVar6;
  ulong uVar7;
  int *piVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  bool bVar14;
  TraceScope traceScope;
  char instBuf [128];
  
  if ((SaveListing(OutputContext&)::token == '\0') &&
     (iVar12 = __cxa_guard_acquire(&SaveListing(OutputContext&)::token), iVar12 != 0)) {
    SaveListing::token = NULLC::TraceGetToken("x86","SaveListing");
    __cxa_guard_release(&SaveListing(OutputContext&)::token);
  }
  NULLC::TraceScope::TraceScope(&traceScope,SaveListing::token);
  if ((this->instList).count == 0) {
    uVar13 = output->outputBufPos;
  }
  else {
    uVar7 = 0;
    do {
      pxVar3 = (this->instList).data;
      uVar13 = pxVar3[uVar7].instID;
      if (uVar13 != 0) {
        uVar13 = uVar13 - 1;
        if ((this->codeJumpTargets).count <= uVar13) {
LAB_00133305:
          pcVar9 = 
          "T &FastVector<unsigned int>::operator[](unsigned int) [T = unsigned int, zeroNewMemory = false, skipConstructor = false]"
          ;
LAB_001332f9:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x7f,pcVar9);
        }
        if ((this->codeJumpTargets).data[uVar13] != 0) {
          pLVar4 = this->exLinker;
          uVar11 = (ulong)(pLVar4->exFunctions).count;
          if (uVar11 != 0) {
            piVar8 = &((pLVar4->exFunctions).data)->regVmAddress;
            uVar10 = 0;
            do {
              if (*piVar8 == uVar13) {
                pcVar9 = (pLVar4->exSymbols).data + ((ExternFuncInfo *)(piVar8 + -1))->offsetToName;
                goto LAB_00132ed7;
              }
              uVar10 = uVar10 + 1;
              piVar8 = piVar8 + 0x25;
            } while (uVar11 != uVar10);
          }
          uVar10 = 0;
          pcVar9 = (char *)0x0;
LAB_00132ed7:
          OutputContext::Print(output,"; ------------------- Invalidation ----------------\n",0x34);
          if (pcVar9 == (char *)0x0) {
            OutputContext::Printf(output,"0x%x: ; %4d",(ulong)(uVar13 | 0xc0000000),(ulong)uVar13);
          }
          else {
            OutputContext::Printf
                      (output,"0x%x: ; %4d // %s#%d",(ulong)(uVar13 | 0xc0000000),(ulong)uVar13,
                       pcVar9,uVar10 & 0xffffffff);
          }
          uVar2 = output->outputBufPos;
          output->outputBufPos = uVar2 + 1;
          output->outputBuf[uVar2] = '\n';
          if (output->outputBufPos == output->outputBufSize) {
            (*output->writeStream)(output->stream,output->outputBuf,output->outputBufPos);
            output->outputBufPos = 0;
          }
        }
        if (uVar13 < this->exRegVmCode->count) {
          pRVar5 = this->exRegVmCode->data;
          OutputContext::Printf(output,"; %4d: ",(ulong)uVar13);
          PrintInstruction(output,(char *)this->exRegVmConstants->data,this->exFunctions->data,
                           (this->exLinker->exSymbols).data,(uint)pRVar5[uVar13].code,
                           pRVar5[uVar13].rA,pRVar5[uVar13].rB,pRVar5[uVar13].rC,
                           pRVar5[uVar13].argument,(VmConstant *)0x0);
          if ((this->codeRegKillInfoOffsets).count <= uVar13) goto LAB_00133305;
          uVar13 = (this->codeRegKillInfoOffsets).data[uVar13];
          uVar11 = (ulong)uVar13;
          if (this->exRegVmRegKillInfo->count <= uVar13) {
LAB_001332e4:
            pcVar9 = 
            "T &FastVector<unsigned char>::operator[](unsigned int) [T = unsigned char, zeroNewMemory = false, skipConstructor = false]"
            ;
            goto LAB_001332f9;
          }
          bVar1 = this->exRegVmRegKillInfo->data[uVar11];
          if (bVar1 != 0) {
            OutputContext::Print(output," // kill",8);
            if (bVar1 < 0x10) {
              uVar11 = (ulong)(uVar13 + 1);
            }
            else {
              OutputContext::Print(output," early[",7);
              iVar12 = 0;
              do {
                uVar11 = uVar11 + 1;
                if (this->exRegVmRegKillInfo->count <= uVar11) goto LAB_001332e4;
                bVar14 = iVar12 == 0;
                iVar12 = iVar12 + -1;
                pcVar9 = ", ";
                if (bVar14) {
                  pcVar9 = "";
                }
                OutputContext::Printf
                          (output,"%sr%d",pcVar9,(ulong)this->exRegVmRegKillInfo->data[uVar11]);
              } while (-(uint)(bVar1 >> 4) != iVar12);
              uVar11 = (ulong)((uVar13 - iVar12) + 1);
              uVar13 = output->outputBufPos;
              output->outputBufPos = uVar13 + 1;
              output->outputBuf[uVar13] = ']';
              if (output->outputBufPos == output->outputBufSize) {
                (*output->writeStream)(output->stream,output->outputBuf,output->outputBufPos);
                output->outputBufPos = 0;
              }
            }
            if ((bVar1 & 0xf) != 0) {
              OutputContext::Print(output," late[",6);
              uVar13 = 0;
              do {
                if (this->exRegVmRegKillInfo->count <= uVar11) goto LAB_001332e4;
                pcVar9 = ", ";
                if (uVar13 == 0) {
                  pcVar9 = "";
                }
                OutputContext::Printf
                          (output,"%sr%d",pcVar9,(ulong)this->exRegVmRegKillInfo->data[uVar11]);
                uVar11 = uVar11 + 1;
                uVar13 = uVar13 + 1;
              } while ((bVar1 & 0xf) != uVar13);
              uVar13 = output->outputBufPos;
              output->outputBufPos = uVar13 + 1;
              output->outputBuf[uVar13] = ']';
              if (output->outputBufPos == output->outputBufSize) {
                (*output->writeStream)(output->stream,output->outputBuf,output->outputBufPos);
                output->outputBufPos = 0;
              }
            }
          }
          uVar13 = output->outputBufPos;
          output->outputBufPos = uVar13 + 1;
          output->outputBuf[uVar13] = '\n';
          if (output->outputBufPos == output->outputBufSize) {
            (*output->writeStream)(output->stream,output->outputBuf,output->outputBufPos);
            output->outputBufPos = 0;
          }
        }
      }
      x86Instruction::Decode(pxVar3 + uVar7,&this->vmState,instBuf,0x80);
      sVar6 = strlen(instBuf);
      OutputContext::Print(output,instBuf,(uint)sVar6);
      uVar13 = output->outputBufPos;
      output->outputBufPos = uVar13 + 1;
      output->outputBuf[uVar13] = '\n';
      uVar13 = output->outputBufPos;
      if (uVar13 == output->outputBufSize) {
        (*output->writeStream)(output->stream,output->outputBuf,uVar13);
        output->outputBufPos = 0;
        uVar13 = 0;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (this->instList).count);
  }
  if (uVar13 != 0) {
    (*output->writeStream)(output->stream,output->outputBuf,uVar13);
  }
  output->outputBufPos = 0;
  NULLC::TraceScope::~TraceScope(&traceScope);
  return;
}

Assistant:

void ExecutorX86::SaveListing(OutputContext &output)
{
	TRACE_SCOPE("x86", "SaveListing");

	const unsigned instBufSize = 128;
	char instBuf[instBufSize];

	for(unsigned i = 0; i < instList.size(); i++)
	{
		x86Instruction &inst = instList[i];

		unsigned instID = inst.instID;

		if(instID && codeJumpTargets[instID - 1])
		{
			const char *functionName = NULL;
			unsigned functionId = 0;

			for(unsigned k = 0, e = exLinker->exFunctions.size(); k != e; k++)
			{
				ExternFuncInfo &funcInfo = exLinker->exFunctions[k];

				if(unsigned(funcInfo.regVmAddress) == instID - 1)
				{
					functionName = funcInfo.offsetToName + exLinker->exSymbols.data;
					functionId = k;
					break;
				}
			}

			output.Print("; ------------------- Invalidation ----------------\n");

			if(functionName)
				output.Printf("0x%x: ; %4d // %s#%d", 0xc0000000 | (instID - 1), instID - 1, functionName, functionId);
			else
				output.Printf("0x%x: ; %4d", 0xc0000000 | (instID - 1), instID - 1);

			output.Print('\n');
		}

		if(instID && instID - 1 < exRegVmCode.size())
		{
			RegVmCmd &cmd = exRegVmCode[instID - 1];

			output.Printf("; %4d: ", instID - 1);

			PrintInstruction(output, (char*)exRegVmConstants.data, exFunctions.data, exLinker->exSymbols.data, RegVmInstructionCode(cmd.code), cmd.rA, cmd.rB, cmd.rC, cmd.argument, NULL);

			unsigned regKillInfoOffset = codeRegKillInfoOffsets[instID - 1];
			unsigned regKillCounts = exRegVmRegKillInfo[regKillInfoOffset];

			if(regKillCounts)
			{
				output.Print(" // kill");

				regKillInfoOffset++;

				unsigned preKillCount = (regKillCounts >> 4);
				unsigned postKillCount = (regKillCounts & 0xf);

				if(preKillCount)
				{
					output.Print(" early[");

					for(unsigned k = 0; k < preKillCount; k++)
						output.Printf("%sr%d", k == 0 ? "" : ", ", exRegVmRegKillInfo[regKillInfoOffset++]);

					output.Print(']');
				}

				if(postKillCount)
				{
					output.Print(" late[");

					for(unsigned k = 0; k < postKillCount; k++)
						output.Printf("%sr%d", k == 0 ? "" : ", ", exRegVmRegKillInfo[regKillInfoOffset++]);

					output.Print(']');
				}
			}

			output.Print('\n');
		}

		inst.Decode(vmState, instBuf, instBufSize);

		output.Print(instBuf);
		output.Print('\n');
	}

	output.Flush();
}